

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyJointLimitConstraint.cpp
# Opt level: O0

void __thiscall
btMultiBodyJointLimitConstraint::createConstraintRows
          (btMultiBodyJointLimitConstraint *this,btMultiBodyConstraintArray *constraintRows,
          btMultiBodyJacobianData *data,btContactSolverInfo *infoGlobal)

{
  int iVar1;
  btVector3 *v;
  btMultibodyLink *pbVar2;
  long in_RCX;
  btMultiBodyConstraint *in_RDI;
  btScalar bVar3;
  float fVar4;
  btVector3 bVar5;
  btScalar velocityImpulse;
  btScalar penetrationImpulse;
  btScalar erp;
  btScalar velocityError;
  btScalar positionalError;
  btScalar penetration;
  btVector3 prismaticAxisInWorld;
  btVector3 revoluteAxisInWorld;
  btScalar rel_vel;
  btVector3 dummy;
  btScalar posError;
  btMultiBodySolverConstraint *constraintRow;
  btScalar direction;
  int row;
  btScalar in_stack_0000029c;
  btScalar in_stack_000002a0;
  undefined1 in_stack_000002a7;
  btScalar in_stack_000002a8;
  btScalar in_stack_000002ac;
  btScalar in_stack_000002b0;
  btScalar in_stack_000002b4;
  btVector3 *in_stack_000002b8;
  btScalar *in_stack_000002c0;
  btScalar *in_stack_000002c8;
  btMultiBodyJacobianData *in_stack_000002d0;
  btMultiBodySolverConstraint *in_stack_000002d8;
  btMultiBodyConstraint *in_stack_000002e0;
  btVector3 *in_stack_000002f0;
  btVector3 *in_stack_000002f8;
  btContactSolverInfo *in_stack_00000300;
  btMultiBody *in_stack_fffffffffffffeb8;
  int row_00;
  btMultiBody *in_stack_fffffffffffffec0;
  btMultiBody *rotation;
  float local_e4;
  float local_e0;
  float local_dc;
  undefined8 local_d4;
  undefined8 local_cc;
  undefined8 local_a4;
  undefined8 uStack_9c;
  undefined8 local_94;
  undefined8 local_8c;
  undefined8 local_64;
  undefined8 uStack_5c;
  btScalar local_50;
  btScalar local_4c;
  btScalar local_48;
  undefined4 local_34;
  btMultiBodySolverConstraint *local_30;
  float local_28;
  btScalar local_24;
  long local_20;
  
  local_20 = in_RCX;
  if (in_RDI->m_numDofsFinalized != in_RDI->m_jacSizeBoth) {
    (*in_RDI->_vptr_btMultiBodyConstraint[2])();
  }
  btMultiBody::getJointPos
            (in_stack_fffffffffffffec0,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
  btMultiBodyConstraint::setPosition
            ((btMultiBodyConstraint *)in_stack_fffffffffffffec0,
             (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),SUB84(in_stack_fffffffffffffeb8,0));
  btMultiBody::getJointPos
            (in_stack_fffffffffffffec0,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
  btMultiBodyConstraint::setPosition
            ((btMultiBodyConstraint *)in_stack_fffffffffffffec0,
             (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),SUB84(in_stack_fffffffffffffeb8,0));
  local_24 = 0.0;
  while( true ) {
    bVar3 = local_24;
    row_00 = (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
    iVar1 = btMultiBodyConstraint::getNumRows(in_RDI);
    if (iVar1 <= (int)bVar3) break;
    local_28 = (float)(int)(-(uint)(local_24 != 0.0) | 1);
    local_30 = btAlignedObjectArray<btMultiBodySolverConstraint>::expandNonInitializing
                         ((btAlignedObjectArray<btMultiBodySolverConstraint> *)
                          in_stack_fffffffffffffec0);
    local_30->m_orgConstraint = in_RDI;
    local_30->m_orgDofIndex = (int)local_24;
    local_30->m_multiBodyA = in_RDI->m_bodyA;
    local_30->m_multiBodyB = in_RDI->m_bodyB;
    local_34 = 0;
    local_48 = 0.0;
    local_4c = 0.0;
    local_50 = 0.0;
    in_stack_fffffffffffffeb8 = (btMultiBody *)&stack0xffffffffffffffbc;
    btVector3::btVector3((btVector3 *)in_stack_fffffffffffffeb8,&local_48,&local_4c,&local_50);
    v = (btVector3 *)
        btMultiBodyConstraint::jacobianA((btMultiBodyConstraint *)in_stack_fffffffffffffec0,row_00);
    btMultiBodyConstraint::jacobianB((btMultiBodyConstraint *)in_stack_fffffffffffffec0,row_00);
    in_stack_fffffffffffffec0 = in_stack_fffffffffffffeb8;
    rotation = in_stack_fffffffffffffeb8;
    local_e0 = btMultiBodyConstraint::fillMultiBodyConstraint
                         (in_stack_000002e0,in_stack_000002d8,in_stack_000002d0,in_stack_000002c8,
                          in_stack_000002c0,in_stack_000002b8,in_stack_000002f0,in_stack_000002f8,
                          in_stack_000002b4,in_stack_00000300,in_stack_000002b0,in_stack_000002ac,
                          in_stack_000002a8,(bool)in_stack_000002a7,in_stack_000002a0,
                          in_stack_0000029c);
    pbVar2 = btMultiBody::getLink
                       (in_stack_fffffffffffffec0,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
    if (pbVar2->m_jointType == eRevolute) {
      btVector3::setZero((btVector3 *)in_stack_fffffffffffffec0);
      btVector3::setZero((btVector3 *)in_stack_fffffffffffffec0);
      btMultiBody::getLink
                (in_stack_fffffffffffffec0,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
      btTransform::getRotation((btTransform *)in_stack_fffffffffffffec0);
      btMultiBody::getLink
                (in_stack_fffffffffffffec0,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
      quatRotate((btQuaternion *)rotation,v);
      bVar5 = ::operator*((btScalar *)in_stack_fffffffffffffec0,
                          (btVector3 *)in_stack_fffffffffffffeb8);
      local_64 = bVar5.m_floats._0_8_;
      uStack_5c = bVar5.m_floats._8_8_;
      *(undefined8 *)(local_30->m_relpos1CrossNormal).m_floats = local_64;
      *(undefined8 *)((local_30->m_relpos1CrossNormal).m_floats + 2) = uStack_5c;
      bVar5 = operator-((btVector3 *)in_stack_fffffffffffffec0);
      local_94 = bVar5.m_floats._0_8_;
      *(undefined8 *)(local_30->m_relpos2CrossNormal).m_floats = local_94;
      local_8c = bVar5.m_floats._8_8_;
      *(undefined8 *)((local_30->m_relpos2CrossNormal).m_floats + 2) = local_8c;
    }
    else if (pbVar2->m_jointType == ePrismatic) {
      btMultiBody::getLink
                (in_stack_fffffffffffffec0,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
      btTransform::getRotation((btTransform *)in_stack_fffffffffffffec0);
      btMultiBody::getLink
                (in_stack_fffffffffffffec0,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
      quatRotate((btQuaternion *)rotation,v);
      bVar5 = ::operator*((btScalar *)in_stack_fffffffffffffec0,
                          (btVector3 *)in_stack_fffffffffffffeb8);
      local_a4 = bVar5.m_floats._0_8_;
      uStack_9c = bVar5.m_floats._8_8_;
      *(undefined8 *)(local_30->m_contactNormal1).m_floats = local_a4;
      *(undefined8 *)((local_30->m_contactNormal1).m_floats + 2) = uStack_9c;
      bVar5 = operator-((btVector3 *)in_stack_fffffffffffffec0);
      local_d4 = bVar5.m_floats._0_8_;
      *(undefined8 *)(local_30->m_contactNormal2).m_floats = local_d4;
      local_cc = bVar5.m_floats._8_8_;
      *(undefined8 *)((local_30->m_contactNormal2).m_floats + 2) = local_cc;
      btVector3::setZero((btVector3 *)in_stack_fffffffffffffec0);
      btVector3::setZero((btVector3 *)in_stack_fffffffffffffec0);
    }
    bVar3 = btMultiBodyConstraint::getPosition
                      ((btMultiBodyConstraint *)in_stack_fffffffffffffec0,
                       (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
    local_e0 = -local_e0;
    local_e4 = *(float *)(local_20 + 0x24);
    if ((*(int *)(local_20 + 0x2c) == 0) ||
       (*(float *)(local_20 + 0x30) <= bVar3 && bVar3 != *(float *)(local_20 + 0x30))) {
      local_e4 = *(float *)(local_20 + 0x20);
    }
    if (bVar3 <= 0.0) {
      local_dc = (-bVar3 * local_e4) / *(float *)(local_20 + 0xc);
    }
    else {
      local_dc = 0.0;
      local_e0 = -bVar3 / *(float *)(local_20 + 0xc);
    }
    local_dc = local_dc * local_30->m_jacDiagABInv;
    fVar4 = local_e0 * local_30->m_jacDiagABInv;
    if ((*(int *)(local_20 + 0x2c) == 0) ||
       (*(float *)(local_20 + 0x30) <= bVar3 && bVar3 != *(float *)(local_20 + 0x30))) {
      local_30->m_rhs = local_dc + fVar4;
      local_30->m_rhsPenetration = 0.0;
    }
    else {
      local_30->m_rhs = fVar4;
      local_30->m_rhsPenetration = local_dc;
    }
    local_24 = (btScalar)((int)local_24 + 1);
  }
  return;
}

Assistant:

void btMultiBodyJointLimitConstraint::createConstraintRows(btMultiBodyConstraintArray& constraintRows,
		btMultiBodyJacobianData& data,
		const btContactSolverInfo& infoGlobal)
{
	
    // only positions need to be updated -- data.m_jacobians and force
    // directions were set in the ctor and never change.

	if (m_numDofsFinalized != m_jacSizeBoth)
	{
        finalizeMultiDof();
	}


    // row 0: the lower bound
    setPosition(0, m_bodyA->getJointPos(m_linkA) - m_lowerBound);			//multidof: this is joint-type dependent

    // row 1: the upper bound
    setPosition(1, m_upperBound - m_bodyA->getJointPos(m_linkA));
	
	for (int row=0;row<getNumRows();row++)
	{
		
		btScalar direction = row? -1 : 1;

		btMultiBodySolverConstraint& constraintRow = constraintRows.expandNonInitializing();
        constraintRow.m_orgConstraint = this;
        constraintRow.m_orgDofIndex = row;
        
		constraintRow.m_multiBodyA = m_bodyA;
		constraintRow.m_multiBodyB = m_bodyB;
		const btScalar posError = 0;						//why assume it's zero?
		const btVector3 dummy(0, 0, 0);

		btScalar rel_vel = fillMultiBodyConstraint(constraintRow,data,jacobianA(row),jacobianB(row),dummy,dummy,dummy,posError,infoGlobal,0,m_maxAppliedImpulse);

		{
			//expect either prismatic or revolute joint type for now
			btAssert((m_bodyA->getLink(m_linkA).m_jointType == btMultibodyLink::eRevolute)||(m_bodyA->getLink(m_linkA).m_jointType == btMultibodyLink::ePrismatic));
			switch (m_bodyA->getLink(m_linkA).m_jointType)
			{
				case btMultibodyLink::eRevolute:
				{
					constraintRow.m_contactNormal1.setZero();
					constraintRow.m_contactNormal2.setZero();
					btVector3 revoluteAxisInWorld = direction*quatRotate(m_bodyA->getLink(m_linkA).m_cachedWorldTransform.getRotation(),m_bodyA->getLink(m_linkA).m_axes[0].m_topVec);
					constraintRow.m_relpos1CrossNormal=revoluteAxisInWorld;
					constraintRow.m_relpos2CrossNormal=-revoluteAxisInWorld;
					
					break;
				}
				case btMultibodyLink::ePrismatic:
				{
					btVector3 prismaticAxisInWorld = direction* quatRotate(m_bodyA->getLink(m_linkA).m_cachedWorldTransform.getRotation(),m_bodyA->getLink(m_linkA).m_axes[0].m_bottomVec);
					constraintRow.m_contactNormal1=prismaticAxisInWorld;
					constraintRow.m_contactNormal2=-prismaticAxisInWorld;
					constraintRow.m_relpos1CrossNormal.setZero();
					constraintRow.m_relpos2CrossNormal.setZero();
					
					break;
				}
				default:
				{
					btAssert(0);
				}
			};
			
		}

		{
			btScalar penetration = getPosition(row);
			btScalar positionalError = 0.f;
			btScalar	velocityError =  - rel_vel;// * damping;
			btScalar erp = infoGlobal.m_erp2;
			if (!infoGlobal.m_splitImpulse || (penetration > infoGlobal.m_splitImpulsePenetrationThreshold))
			{
				erp = infoGlobal.m_erp;
			}
			if (penetration>0)
			{
				positionalError = 0;
				velocityError = -penetration / infoGlobal.m_timeStep;
			} else
			{
				positionalError = -penetration * erp/infoGlobal.m_timeStep;
			}

			btScalar  penetrationImpulse = positionalError*constraintRow.m_jacDiagABInv;
			btScalar velocityImpulse = velocityError *constraintRow.m_jacDiagABInv;
			if (!infoGlobal.m_splitImpulse || (penetration > infoGlobal.m_splitImpulsePenetrationThreshold))
			{
				//combine position and velocity into rhs
				constraintRow.m_rhs = penetrationImpulse+velocityImpulse;
				constraintRow.m_rhsPenetration = 0.f;

			} else
			{
				//split position and velocity into rhs and m_rhsPenetration
				constraintRow.m_rhs = velocityImpulse;
				constraintRow.m_rhsPenetration = penetrationImpulse;
			}
		}
	}

}